

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emulate.cpp
# Opt level: O0

cl_int clGetMemAllocInfoINTEL_EMU
                 (cl_context context,void *ptr,cl_mem_info_intel param_name,size_t param_value_size,
                 void *param_value,size_t *param_value_size_ret)

{
  cl_int cVar1;
  CLIntercept *this;
  SConfig *pSVar2;
  CLIntercept *pIntercept;
  undefined4 in_stack_00000028;
  cl_context in_stack_00000040;
  CLIntercept *in_stack_00000048;
  size_t *in_stack_00000060;
  
  this = GetIntercept();
  if (this != (CLIntercept *)0x0) {
    pSVar2 = CLIntercept::config(this);
    if ((pSVar2->Emulate_cl_intel_unified_shared_memory & 1U) != 0) {
      cVar1 = CLIntercept::emulatedGetMemAllocInfoINTEL
                        (in_stack_00000048,in_stack_00000040,context,ptr._4_4_,
                         CONCAT44(param_name,in_stack_00000028),(void *)param_value_size,
                         in_stack_00000060);
      return cVar1;
    }
  }
  return -0x3b;
}

Assistant:

cl_int CL_API_CALL clGetMemAllocInfoINTEL_EMU(
    cl_context context,
    const void* ptr,
    cl_mem_info_intel param_name,
    size_t param_value_size,
    void* param_value,
    size_t* param_value_size_ret)
{
    CLIntercept*    pIntercept = GetIntercept();

    if( pIntercept && pIntercept->config().Emulate_cl_intel_unified_shared_memory )
    {
        return pIntercept->emulatedGetMemAllocInfoINTEL(
            context,
            ptr,
            param_name,
            param_value_size,
            param_value,
            param_value_size_ret );
    }

    return CL_INVALID_OPERATION;
}